

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockFormerVisitor.cpp
# Opt level: O1

void __thiscall
IRT::BlockFormerVisitor::Visit(BlockFormerVisitor *this,NameExpression *name_expression)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  NameExpression *this_00;
  Label local_40;
  
  this_00 = (NameExpression *)operator_new(0x28);
  paVar1 = &local_40.label_.field_2;
  pcVar2 = (name_expression->label_).label_._M_dataplus._M_p;
  local_40.label_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + (name_expression->label_).label_._M_string_length);
  NameExpression::NameExpression(this_00,&local_40);
  (this->super_TemplateVisitor<IRT::IRTStorage>).tos_value_.expression_ = (Expression *)this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.label_._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.label_._M_dataplus._M_p,
                    local_40.label_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void BlockFormerVisitor::Visit(NameExpression* name_expression) {
  tos_value_.expression_ = new NameExpression(name_expression->label_);
}